

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

int NULLCTypeInfo::TypeArraySize(int *typeID)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  ExternTypeInfo *type;
  int *typeID_local;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),*typeID);
    if (pEVar1->subCat == CAT_ARRAY) {
      typeID_local._4_4_ = (pEVar1->field_8).arrSize;
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("typeid::arraySize received type (%s) that is not an array",pcVar2);
      typeID_local._4_4_ = 0xffffffff;
    }
    return typeID_local._4_4_;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xd3,"int NULLCTypeInfo::TypeArraySize(int *)");
}

Assistant:

int TypeArraySize(int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_ARRAY)
		{
			nullcThrowError("typeid::arraySize received type (%s) that is not an array", &linker->exSymbols[type.offsetToName]);
			return -1;
		}
		return type.arrSize;
	}